

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O1

void __thiscall ScopedMetric::~ScopedMetric(ScopedMetric *this)

{
  int *piVar1;
  int64_t *piVar2;
  int64_t iVar3;
  
  if (this->metric_ != (Metric *)0x0) {
    piVar1 = &this->metric_->count;
    *piVar1 = *piVar1 + 1;
    iVar3 = anon_unknown.dwarf_cf17e::HighResTimer();
    piVar2 = &this->metric_->sum;
    *piVar2 = *piVar2 + (iVar3 - this->start_);
  }
  return;
}

Assistant:

ScopedMetric::~ScopedMetric() {
  if (!metric_)
    return;
  metric_->count++;
  int64_t dt = TimerToMicros(HighResTimer() - start_);
  metric_->sum += dt;
}